

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

void IoTHubRegistryManager_FreeDeviceExMembers(IOTHUB_DEVICE_EX *deviceInfo)

{
  IOTHUB_DEVICE_EX *deviceInfo_local;
  
  free(deviceInfo->deviceId);
  free(deviceInfo->primaryKey);
  free(deviceInfo->secondaryKey);
  free(deviceInfo->generationId);
  free(deviceInfo->eTag);
  free(deviceInfo->connectionStateUpdatedTime);
  free(deviceInfo->statusReason);
  free(deviceInfo->statusUpdatedTime);
  free(deviceInfo->lastActivityTime);
  free(deviceInfo->configuration);
  free(deviceInfo->deviceProperties);
  free(deviceInfo->serviceProperties);
  memset(deviceInfo,0,0x90);
  return;
}

Assistant:

void IoTHubRegistryManager_FreeDeviceExMembers(IOTHUB_DEVICE_EX* deviceInfo)
{
    free((void*)deviceInfo->deviceId);
    free((void*)deviceInfo->primaryKey);
    free((void*)deviceInfo->secondaryKey);
    free((void*)deviceInfo->generationId);
    free((void*)deviceInfo->eTag);
    free((void*)deviceInfo->connectionStateUpdatedTime);
    free((void*)deviceInfo->statusReason);
    free((void*)deviceInfo->statusUpdatedTime);
    free((void*)deviceInfo->lastActivityTime);
    free((void*)deviceInfo->configuration);
    free((void*)deviceInfo->deviceProperties);
    free((void*)deviceInfo->serviceProperties);
    memset(deviceInfo, 0, sizeof(*deviceInfo));
}